

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents,
                      _Bool hpa)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  emitter_col_t *peVar4;
  int iVar5;
  emitter_output_t eVar6;
  int iVar7;
  tsd_t *ptVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  tsd_t *ptVar14;
  undefined7 in_register_00000009;
  uint64_t uVar15;
  undefined7 in_register_00000011;
  uint64_t uptime_s;
  emitter_row_t eVar16;
  emitter_col_t *peVar17;
  emitter_justify_t *peVar18;
  emitter_type_t eVar19;
  char *format;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  undefined1 uVar20;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar21;
  char *pcVar22;
  bool bVar23;
  undefined1 uVar24;
  size_t sz_1;
  emitter_type_t local_9e0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9d8;
  emitter_col_t *local_9d0;
  emitter_col_t *local_9c8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9c0;
  size_t miblen;
  emitter_type_t local_9b0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_9a8;
  emitter_col_t *local_9a0;
  emitter_col_t *local_998;
  uint64_t uptime;
  size_t miblen_new_9;
  size_t ndirty_nonhuge;
  size_t nactive_nonhuge;
  size_t npageslabs_nonhuge;
  size_t npageslabs_huge;
  size_t sz_63;
  size_t ndirty_huge;
  size_t nactive_huge;
  undefined4 local_934;
  undefined8 local_930;
  undefined4 local_928;
  char *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  uint64_t local_908;
  ulong local_900;
  size_t pactive;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  uint nthreads;
  undefined8 local_8e0;
  undefined4 local_8d8;
  char *local_8d0;
  emitter_justify_t *local_8c8;
  emitter_justify_t *local_8c0;
  size_t sz_40;
  emitter_type_t local_8b0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_8a8;
  emitter_col_t *local_8a0;
  emitter_col_t *local_898;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t pmuzzy;
  size_t pdirty;
  size_t page;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  char *namep;
  size_t miblen_new;
  emitter_type_t local_7c8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_7c0;
  emitter_col_t *local_7b8;
  emitter_col_t *local_7b0;
  uint64_t ndehugifies;
  uint64_t nhugifies;
  uint64_t npurges;
  uint64_t npurge_passes;
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_780;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_778 [3];
  uint64_t local_760;
  undefined4 local_758;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_750;
  undefined4 local_730;
  ulong local_728 [4];
  undefined4 local_708;
  ulong local_700;
  undefined4 local_6e0;
  ulong local_6d8 [4];
  undefined4 local_6b8;
  ulong local_6b0;
  undefined4 local_690;
  ulong local_688 [4];
  undefined4 local_668;
  ulong local_660;
  undefined4 local_640;
  ulong local_638 [4];
  undefined4 local_618;
  ulong local_610;
  undefined4 local_5f0;
  undefined1 local_5e8 [24];
  tsd_t *local_5d0;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests;
  size_t abandoned_vm;
  size_t tcache_stashed_bytes;
  size_t tcache_bytes;
  size_t extent_avail;
  size_t metadata_thp;
  size_t metadata_rtree;
  size_t metadata_edata;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  char *dss;
  size_t sec_bytes;
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col32 [1];
  emitter_col_t local_440;
  emitter_col_t local_418;
  emitter_col_t local_3f0;
  emitter_col_t local_3c8;
  emitter_col_t local_3a0;
  undefined8 local_378;
  emitter_type_t local_370;
  char *local_368;
  emitter_justify_t *local_360;
  undefined8 *local_358;
  undefined8 local_350;
  emitter_type_t local_348;
  char *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 local_328;
  emitter_type_t local_320;
  char *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  char *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  int local_2d0;
  char *local_2c8;
  undefined8 *local_2c0;
  emitter_justify_t *local_2b8;
  emitter_row_t row;
  emitter_col_t local_288;
  undefined8 local_260;
  undefined4 local_258;
  char *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  emitter_col_t local_238;
  emitter_col_t local_210;
  emitter_col_t local_1e8;
  emitter_col_t local_1c0;
  emitter_col_t local_198;
  emitter_col_t local_170;
  char name [32];
  emitter_col_t local_120;
  emitter_col_t local_f8;
  emitter_col_t local_d0;
  emitter_col_t local_a8;
  emitter_col_t local_80;
  emitter_col_t local_58;
  
  local_934 = (undefined4)CONCAT71(in_register_00000081,mutex);
  local_8e8 = (undefined4)CONCAT71(in_register_00000009,large);
  local_8ec = (undefined4)CONCAT71(in_register_00000011,bins);
  namep = name;
  sz = 8;
  iVar5 = duckdb_je_mallctl("arenas.page",&page,&sz,(void *)0x0,0);
  if (iVar5 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar22 = "arenas.page";
    goto LAB_00ce9b07;
  }
  aVar21.uint64_val._4_4_ = 0;
  aVar21.unsigned_val = i;
  if (i - 0x1002 < 0xfffffffe) {
    miblen = 7;
    sz_1 = 8;
    iVar5 = duckdb_je_mallctlnametomib("arena.0.name",&sz,&miblen);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar22 = "arena.0.name";
      goto LAB_00ce9b07;
    }
    local_780 = aVar21;
    iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&namep,&sz_1,(void *)0x0,0);
    if (iVar5 == 0) {
      emitter_kv_note(emitter,"name","name",emitter_type_string,&namep,(char *)0x0,emitter_type_bool
                      ,(void *)0x0);
      goto LAB_00ce5075;
    }
  }
  else {
LAB_00ce5075:
    miblen = 7;
    sz_1 = 4;
    iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.nthreads",&sz,&miblen);
    if (iVar5 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar22 = "stats.arenas.0.nthreads";
      goto LAB_00ce9b07;
    }
    local_778[0] = aVar21;
    iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&nthreads,&sz_1,(void *)0x0,0);
    if (iVar5 == 0) {
      emitter_kv_note(emitter,"nthreads","assigned threads",emitter_type_unsigned,&nthreads,
                      (char *)0x0,emitter_type_bool,(void *)0x0);
      miblen = 7;
      sz_1 = 8;
      iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.uptime",&sz,&miblen);
      if (iVar5 != 0) {
        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar22 = "stats.arenas.0.uptime";
        goto LAB_00ce9b07;
      }
      local_778[0] = aVar21;
      iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&uptime,&sz_1,(void *)0x0,0);
      if (iVar5 == 0) {
        emitter_kv_note(emitter,"uptime_ns","uptime",emitter_type_uint64,&uptime,(char *)0x0,
                        emitter_type_bool,(void *)0x0);
        miblen = 7;
        sz_1 = 8;
        iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.dss",&sz,&miblen);
        if (iVar5 != 0) {
          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
          pcVar22 = "stats.arenas.0.dss";
          goto LAB_00ce9b07;
        }
        local_778[0] = aVar21;
        iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&dss,&sz_1,(void *)0x0,0);
        if (iVar5 == 0) {
          emitter_kv_note(emitter,"dss","dss allocation precedence",emitter_type_string,&dss,
                          (char *)0x0,emitter_type_bool,(void *)0x0);
          miblen = 7;
          sz_1 = 8;
          iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.dirty_decay_ms",&sz,&miblen);
          if (iVar5 != 0) {
            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
            pcVar22 = "stats.arenas.0.dirty_decay_ms";
            goto LAB_00ce9b07;
          }
          local_778[0] = aVar21;
          iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_decay_ms,&sz_1,(void *)0x0,0);
          if (iVar5 == 0) {
            miblen = 7;
            sz_1 = 8;
            iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.muzzy_decay_ms",&sz,&miblen);
            if (iVar5 != 0) {
              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
              pcVar22 = "stats.arenas.0.muzzy_decay_ms";
              goto LAB_00ce9b07;
            }
            local_778[0] = aVar21;
            iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&muzzy_decay_ms,&sz_1,(void *)0x0,0);
            if (iVar5 == 0) {
              miblen = 7;
              sz_1 = 8;
              iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.pactive",&sz,&miblen);
              if (iVar5 != 0) {
                format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                pcVar22 = "stats.arenas.0.pactive";
                goto LAB_00ce9b07;
              }
              local_778[0] = aVar21;
              iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&pactive,&sz_1,(void *)0x0,0);
              if (iVar5 == 0) {
                miblen = 7;
                sz_1 = 8;
                iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.pdirty",&sz,&miblen);
                if (iVar5 != 0) {
                  format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                  pcVar22 = "stats.arenas.0.pdirty";
                  goto LAB_00ce9b07;
                }
                local_778[0] = aVar21;
                iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&pdirty,&sz_1,(void *)0x0,0);
                if (iVar5 == 0) {
                  miblen = 7;
                  sz_1 = 8;
                  iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.pmuzzy",&sz,&miblen);
                  if (iVar5 != 0) {
                    format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                    pcVar22 = "stats.arenas.0.pmuzzy";
                    goto LAB_00ce9b07;
                  }
                  local_778[0] = aVar21;
                  iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&pmuzzy,&sz_1,(void *)0x0,0);
                  if (iVar5 == 0) {
                    miblen = 7;
                    sz_1 = 8;
                    iVar5 = duckdb_je_mallctlnametomib("stats.arenas.0.dirty_npurge",&sz,&miblen);
                    if (iVar5 != 0) {
                      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                      pcVar22 = "stats.arenas.0.dirty_npurge";
                      goto LAB_00ce9b07;
                    }
                    local_778[0] = aVar21;
                    iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_npurge,&sz_1,(void *)0x0,0);
                    if (iVar5 == 0) {
                      miblen = 7;
                      sz_1 = 8;
                      iVar5 = duckdb_je_mallctlnametomib
                                        ("stats.arenas.0.dirty_nmadvise",&sz,&miblen);
                      if (iVar5 != 0) {
                        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                        pcVar22 = "stats.arenas.0.dirty_nmadvise";
                        goto LAB_00ce9b07;
                      }
                      local_778[0] = aVar21;
                      iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_nmadvise,&sz_1,(void *)0x0,0)
                      ;
                      if (iVar5 == 0) {
                        miblen = 7;
                        sz_1 = 8;
                        iVar5 = duckdb_je_mallctlnametomib
                                          ("stats.arenas.0.dirty_purged",&sz,&miblen);
                        if (iVar5 != 0) {
                          format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                          pcVar22 = "stats.arenas.0.dirty_purged";
                          goto LAB_00ce9b07;
                        }
                        local_778[0] = aVar21;
                        iVar5 = duckdb_je_mallctlbymib(&sz,miblen,&dirty_purged,&sz_1,(void *)0x0,0)
                        ;
                        if (iVar5 == 0) {
                          miblen = 7;
                          sz_1 = 8;
                          iVar5 = duckdb_je_mallctlnametomib
                                            ("stats.arenas.0.muzzy_npurge",&sz,&miblen);
                          if (iVar5 != 0) {
                            format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                            pcVar22 = "stats.arenas.0.muzzy_npurge";
                            goto LAB_00ce9b07;
                          }
                          local_778[0] = aVar21;
                          iVar5 = duckdb_je_mallctlbymib
                                            (&sz,miblen,&muzzy_npurge,&sz_1,(void *)0x0,0);
                          if (iVar5 == 0) {
                            miblen = 7;
                            sz_1 = 8;
                            iVar5 = duckdb_je_mallctlnametomib
                                              ("stats.arenas.0.muzzy_nmadvise",&sz,&miblen);
                            if (iVar5 != 0) {
                              format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                              pcVar22 = "stats.arenas.0.muzzy_nmadvise";
                              goto LAB_00ce9b07;
                            }
                            local_778[0] = aVar21;
                            iVar5 = duckdb_je_mallctlbymib
                                              (&sz,miblen,&muzzy_nmadvise,&sz_1,(void *)0x0,0);
                            if (iVar5 == 0) {
                              miblen = 7;
                              sz_1 = 8;
                              iVar5 = duckdb_je_mallctlnametomib
                                                ("stats.arenas.0.muzzy_purged",&sz,&miblen);
                              if (iVar5 != 0) {
                                format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                pcVar22 = "stats.arenas.0.muzzy_purged";
                                goto LAB_00ce9b07;
                              }
                              local_8f0 = (undefined4)CONCAT71(in_register_00000089,extents);
                              local_778[0] = aVar21;
                              iVar5 = duckdb_je_mallctlbymib
                                                (&sz,miblen,&muzzy_purged,&sz_1,(void *)0x0,0);
                              if (iVar5 == 0) {
                                emitter_json_kv(emitter,"dirty_decay_ms",emitter_type_ssize,
                                                &dirty_decay_ms);
                                emitter_json_kv(emitter,"muzzy_decay_ms",emitter_type_ssize,
                                                &muzzy_decay_ms);
                                emitter_json_kv(emitter,"pactive",emitter_type_size,&pactive);
                                emitter_json_kv(emitter,"pdirty",emitter_type_size,&pdirty);
                                emitter_json_kv(emitter,"pmuzzy",emitter_type_size,&pmuzzy);
                                eVar19 = emitter_type_uint64;
                                emitter_json_kv(emitter,"dirty_npurge",emitter_type_uint64,
                                                &dirty_npurge);
                                emitter_json_kv(emitter,"dirty_nmadvise",emitter_type_uint64,
                                                &dirty_nmadvise);
                                emitter_json_kv(emitter,"dirty_purged",emitter_type_uint64,
                                                &dirty_purged);
                                emitter_json_kv(emitter,"muzzy_npurge",emitter_type_uint64,
                                                &muzzy_npurge);
                                emitter_json_kv(emitter,"muzzy_nmadvise",emitter_type_uint64,
                                                &muzzy_nmadvise);
                                emitter_json_kv(emitter,"muzzy_purged",emitter_type_uint64,
                                                &muzzy_purged);
                                local_260 = 0x900000001;
                                local_370 = 9;
                                local_258 = 9;
                                local_250 = "decaying:";
                                local_2b8 = (emitter_justify_t *)&local_260;
                                local_248 = &local_2d8;
                                local_2d8 = 0x600000001;
                                local_2c8 = "time";
                                local_2e0 = &local_2d8;
                                local_2c0 = &local_300;
                                local_300 = 0xd00000001;
                                local_2f0 = "npages";
                                local_308 = &local_300;
                                local_2e8 = &local_328;
                                local_328 = 0xd00000001;
                                local_318 = "sweeps";
                                local_330 = &local_328;
                                local_310 = &local_350;
                                local_350 = 0xd00000001;
                                local_340 = "madvises";
                                local_240 = &local_378;
                                local_358 = &local_350;
                                local_360 = (emitter_justify_t *)&local_260;
                                local_338 = &local_378;
                                local_378 = 0xd00000001;
                                local_368 = "purged";
                                peVar18 = (emitter_justify_t *)&local_260;
                                local_348 = local_370;
                                local_320 = local_370;
                                local_2f8 = local_370;
                                local_2d0 = local_370;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar18 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar18,peVar18[1],peVar18[2],
                                                        peVar18 + 4);
                                    peVar18 = *(emitter_justify_t **)(peVar18 + 6);
                                  } while (peVar18 != (emitter_justify_t *)&local_260);
                                  emitter_table_printf(emitter,anon_var_dwarf_63b9037 + 8);
                                }
                                local_250 = "dirty:";
                                local_2d0 = (int)(dirty_decay_ms >> 0x3f) * -2 + 7;
                                pcVar22 = "N/A";
                                if (dirty_decay_ms < 0) {
                                  dirty_decay_ms = (ssize_t)"N/A";
                                }
                                local_2f8 = 6;
                                local_370 = eVar19;
                                local_348 = eVar19;
                                local_320 = eVar19;
                                peVar18 = (emitter_justify_t *)&local_260;
                                local_2c8 = (char *)dirty_decay_ms;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar18 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar18,peVar18[1],peVar18[2],
                                                        peVar18 + 4);
                                    peVar18 = *(emitter_justify_t **)(peVar18 + 6);
                                  } while (peVar18 != (emitter_justify_t *)&local_260);
                                  emitter_table_printf(emitter,anon_var_dwarf_63b9037 + 8);
                                }
                                local_250 = "muzzy:";
                                if (-1 < muzzy_decay_ms) {
                                  pcVar22 = (char *)muzzy_decay_ms;
                                }
                                local_2d0 = (int)(muzzy_decay_ms >> 0x3f) * -2 + 7;
                                local_2c8 = pcVar22;
                                local_2f8 = 6;
                                local_2f0 = (char *)pmuzzy;
                                local_320 = 5;
                                local_318 = (char *)muzzy_npurge;
                                local_348 = 5;
                                local_340 = (char *)muzzy_nmadvise;
                                local_370 = 5;
                                local_368 = (char *)muzzy_purged;
                                peVar18 = (emitter_justify_t *)&local_260;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar18 == (emitter_justify_t *)0x0) break;
                                    emitter_print_value(emitter,*peVar18,peVar18[1],peVar18[2],
                                                        peVar18 + 4);
                                    peVar18 = *(emitter_justify_t **)(peVar18 + 6);
                                  } while (peVar18 != (emitter_justify_t *)&local_260);
                                  emitter_table_printf(emitter,anon_var_dwarf_63b9037 + 8);
                                }
                                local_900 = (ulong)i;
                                local_288.justify = emitter_justify_left;
                                local_288.width = 0x15;
                                local_288.type = emitter_type_title;
                                local_288.field_3.str_val = anon_var_dwarf_63b90fe + 9;
                                local_3f0.link.qre_prev = &local_288;
                                local_288.link.qre_next = &local_3f0;
                                local_3f0.justify = emitter_justify_right;
                                local_3f0.width = 0x10;
                                local_3f0.type = emitter_type_title;
                                local_3f0.field_3.str_val = "allocated";
                                local_418.link.qre_prev = &local_3f0;
                                local_3f0.link.qre_next = &local_418;
                                local_418.justify = emitter_justify_right;
                                local_418.width = 0x10;
                                local_418.type = emitter_type_title;
                                local_418.field_3.str_val = "nmalloc";
                                local_3a0.link.qre_prev = &local_418;
                                local_418.link.qre_next = &local_3a0;
                                local_3a0.justify = emitter_justify_right;
                                local_3a0.width = 10;
                                local_3a0.type = emitter_type_title;
                                local_3a0.field_3 =
                                     (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x1ea340e;
                                local_440.link.qre_prev = &local_3a0;
                                local_3a0.link.qre_next = &local_440;
                                local_440.justify = emitter_justify_right;
                                local_440.width = 0x10;
                                local_440.type = emitter_type_title;
                                local_440.field_3.str_val = "ndalloc";
                                local_288.link.qre_prev = &local_3c8;
                                local_3c8.link.qre_prev = &local_440;
                                local_3c8.link.qre_next = &local_288;
                                local_440.link.qre_next = &local_3c8;
                                local_3c8.justify = emitter_justify_right;
                                local_3c8.width = 10;
                                local_3c8.type = emitter_type_title;
                                local_3c8.field_3.str_val = "(#/sec)";
                                col_count_nrequests.link.qre_next = &col_count_nrequests;
                                col_count_nrequests.link.qre_prev = &col_count_nrequests;
                                if (&local_288 != (emitter_col_t *)0x0) {
                                  local_288.link.qre_prev = &col_count_nrequests;
                                  col_count_nrequests.link.qre_next = &local_3c8;
                                  col_count_nrequests.link.qre_prev = &local_3c8;
                                }
                                col_count_nrequests.link.qre_next =
                                     col_count_nrequests.link.qre_prev;
                                col_count_nrequests.justify = emitter_justify_right;
                                col_count_nrequests.width = 0x10;
                                col_count_nrequests.type = emitter_type_title;
                                col_count_nrequests.field_3.str_val = "nrequests";
                                col_count_nrequests_ps.link.qre_next = &col_count_nrequests_ps;
                                col_count_nrequests_ps.link.qre_prev = &col_count_nrequests_ps;
                                if (col_count_nrequests.link.qre_prev != (emitter_col_t *)0x0) {
                                  col_count_nrequests_ps.link.qre_next =
                                       ((col_count_nrequests.link.qre_prev)->link).qre_prev;
                                  ((col_count_nrequests.link.qre_prev)->link).qre_prev =
                                       &col_count_nrequests_ps;
                                  col_count_nrequests_ps.link.qre_prev =
                                       ((col_count_nrequests_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nrequests.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nrequests.link.qre_next;
                                  ((col_count_nrequests_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nrequests_ps;
                                }
                                col_count_nrequests_ps.justify = emitter_justify_right;
                                col_count_nrequests_ps.width = 10;
                                col_count_nrequests_ps.type = emitter_type_title;
                                col_count_nrequests_ps.field_3.str_val = "(#/sec)";
                                col_count_nfills.link.qre_next = &col_count_nfills;
                                col_count_nfills.link.qre_prev = col_count_nfills.link.qre_next;
                                if (col_count_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nfills.link.qre_next =
                                       ((col_count_nrequests_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_nrequests_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nfills;
                                  col_count_nfills.link.qre_prev = col_count_nfills.link.qre_next;
                                  ((((col_count_nrequests_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nrequests_ps.link.qre_next;
                                  ((col_count_nfills.link.qre_next)->link).qre_next =
                                       &col_count_nfills;
                                }
                                col_count_nfills.justify = emitter_justify_right;
                                col_count_nfills.width = 0x10;
                                col_count_nfills.type = emitter_type_title;
                                col_count_nfills.field_3.str_val = "nfill";
                                col_count_nfills_ps.link.qre_next = &col_count_nfills_ps;
                                col_count_nfills_ps.link.qre_prev = &col_count_nfills_ps;
                                col_count_nfills.link.qre_prev = col_count_nfills.link.qre_next;
                                if (col_count_nfills.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nfills_ps.link.qre_next =
                                       ((col_count_nfills.link.qre_next)->link).qre_prev;
                                  ((col_count_nfills.link.qre_next)->link).qre_prev =
                                       &col_count_nfills_ps;
                                  col_count_nfills_ps.link.qre_prev =
                                       ((col_count_nfills_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nfills.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nfills.link.qre_next;
                                  ((col_count_nfills_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nfills_ps;
                                }
                                local_9c0 = aVar21;
                                col_count_nfills_ps.justify = emitter_justify_right;
                                col_count_nfills_ps.width = 10;
                                col_count_nfills_ps.type = emitter_type_title;
                                col_count_nfills_ps.field_3.str_val = "(#/sec)";
                                col_count_nflushes.link.qre_next = &col_count_nflushes;
                                col_count_nflushes.link.qre_prev = col_count_nflushes.link.qre_next;
                                if (col_count_nfills_ps.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nflushes.link.qre_next =
                                       ((col_count_nfills_ps.link.qre_next)->link).qre_prev;
                                  ((col_count_nfills_ps.link.qre_next)->link).qre_prev =
                                       &col_count_nflushes;
                                  col_count_nflushes.link.qre_prev =
                                       col_count_nflushes.link.qre_next;
                                  ((((col_count_nfills_ps.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nfills_ps.link.qre_next;
                                  ((col_count_nflushes.link.qre_next)->link).qre_next =
                                       &col_count_nflushes;
                                }
                                col_count_nflushes.justify = emitter_justify_right;
                                col_count_nflushes.width = 0x10;
                                col_count_nflushes.type = emitter_type_title;
                                col_count_nflushes.field_3.str_val = "nflush";
                                col_count_nflushes_ps.link.qre_next = &col_count_nflushes_ps;
                                col_count_nflushes_ps.link.qre_prev = &col_count_nflushes_ps;
                                col_count_nflushes.link.qre_prev = col_count_nflushes.link.qre_next;
                                if (col_count_nflushes.link.qre_next != (emitter_col_t *)0x0) {
                                  col_count_nflushes_ps.link.qre_next =
                                       ((col_count_nflushes.link.qre_next)->link).qre_prev;
                                  ((col_count_nflushes.link.qre_next)->link).qre_prev =
                                       &col_count_nflushes_ps;
                                  col_count_nflushes_ps.link.qre_prev =
                                       ((col_count_nflushes_ps.link.qre_prev)->link).qre_next;
                                  ((((col_count_nflushes.link.qre_next)->link).qre_prev)->link).
                                  qre_next = col_count_nflushes.link.qre_next;
                                  ((col_count_nflushes_ps.link.qre_prev)->link).qre_next =
                                       &col_count_nflushes_ps;
                                }
                                peVar4 = col_count_nflushes_ps.link.qre_next;
                                col_count_nflushes_ps.justify = emitter_justify_right;
                                col_count_nflushes_ps.width = 10;
                                col_count_nflushes_ps.type = emitter_type_title;
                                col_count_nflushes_ps.field_3.str_val = "(#/sec)";
                                peVar17 = col_count_nflushes_ps.link.qre_next;
                                if (emitter->output == emitter_output_table) {
                                  do {
                                    if (peVar17 == (emitter_col_t *)0x0) break;
                                    emitter_print_value(emitter,peVar17->justify,peVar17->width,
                                                        peVar17->type,&peVar17->field_3);
                                    peVar17 = (peVar17->link).qre_next;
                                  } while (peVar17 != peVar4);
                                  emitter_table_printf(emitter,anon_var_dwarf_63b9037 + 8);
                                }
                                col_count_nflushes_ps.type = eVar19;
                                col_count_nfills_ps.type = eVar19;
                                col_count_nrequests_ps.type = eVar19;
                                local_3c8.type = eVar19;
                                local_3a0.type = eVar19;
                                emitter_json_object_kv_begin(emitter,"small");
                                local_288.field_3 =
                                     (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x1ea3633;
                                miblen = 7;
                                sz_1 = 8;
                                iVar5 = duckdb_je_mallctlnametomib
                                                  ("stats.arenas.0.small.allocated",&sz,&miblen);
                                if (iVar5 != 0) {
                                  format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                  ;
                                  pcVar22 = "stats.arenas.0.small.allocated";
                                  goto LAB_00ce9b07;
                                }
                                local_778[0] = local_9c0;
                                iVar5 = duckdb_je_mallctlbymib
                                                  (&sz,miblen,&small_allocated,&sz_1,(void *)0x0,0);
                                if (iVar5 == 0) {
                                  emitter_json_kv(emitter,"allocated",emitter_type_size,
                                                  &small_allocated);
                                  local_3f0.type = emitter_type_size;
                                  local_3f0.field_3.size_val = small_allocated;
                                  miblen = 7;
                                  sz_1 = 8;
                                  iVar5 = duckdb_je_mallctlnametomib
                                                    ("stats.arenas.0.small.nmalloc",&sz,&miblen);
                                  if (iVar5 != 0) {
                                    format = 
                                    "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                    pcVar22 = "stats.arenas.0.small.nmalloc";
                                    goto LAB_00ce9b07;
                                  }
                                  local_778[0] = local_9c0;
                                  iVar5 = duckdb_je_mallctlbymib
                                                    (&sz,miblen,&small_nmalloc,&sz_1,(void *)0x0,0);
                                  if (iVar5 == 0) {
                                    emitter_json_kv(emitter,"nmalloc",emitter_type_uint64,
                                                    &small_nmalloc);
                                    local_418.type = emitter_type_uint64;
                                    local_418.field_3.uint64_val = small_nmalloc;
                                    if (small_nmalloc == 0 || uptime == 0) {
                                      local_3a0.field_3.uint64_val = 0;
                                    }
                                    else {
                                      local_3a0.field_3.uint64_val = small_nmalloc;
                                      if (999999999 < uptime) {
                                        local_3a0.field_3.uint64_val =
                                             small_nmalloc / (uptime / 1000000000);
                                      }
                                    }
                                    miblen = 7;
                                    sz_1 = 8;
                                    iVar5 = duckdb_je_mallctlnametomib
                                                      ("stats.arenas.0.small.ndalloc",&sz,&miblen);
                                    if (iVar5 != 0) {
                                      format = 
                                      "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                      pcVar22 = "stats.arenas.0.small.ndalloc";
                                      goto LAB_00ce9b07;
                                    }
                                    local_778[0] = local_9c0;
                                    iVar5 = duckdb_je_mallctlbymib
                                                      (&sz,miblen,&small_ndalloc,&sz_1,(void *)0x0,0
                                                      );
                                    if (iVar5 == 0) {
                                      emitter_json_kv(emitter,"ndalloc",emitter_type_uint64,
                                                      &small_ndalloc);
                                      local_440.type = emitter_type_uint64;
                                      local_440.field_3.uint64_val = small_ndalloc;
                                      if (small_ndalloc == 0 || uptime == 0) {
                                        local_3c8.field_3.uint64_val = 0;
                                      }
                                      else {
                                        local_3c8.field_3.uint64_val = small_ndalloc;
                                        if (999999999 < uptime) {
                                          local_3c8.field_3.uint64_val =
                                               small_ndalloc / (uptime / 1000000000);
                                        }
                                      }
                                      miblen = 7;
                                      sz_1 = 8;
                                      iVar5 = duckdb_je_mallctlnametomib
                                                        ("stats.arenas.0.small.nrequests",&sz,
                                                         &miblen);
                                      if (iVar5 != 0) {
                                        format = 
                                        "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                        pcVar22 = "stats.arenas.0.small.nrequests";
                                        goto LAB_00ce9b07;
                                      }
                                      local_778[0] = local_9c0;
                                      iVar5 = duckdb_je_mallctlbymib
                                                        (&sz,miblen,&small_nrequests,&sz_1,
                                                         (void *)0x0,0);
                                      if (iVar5 == 0) {
                                        emitter_json_kv(emitter,"nrequests",emitter_type_uint64,
                                                        &small_nrequests);
                                        col_count_nrequests.type = emitter_type_uint64;
                                        col_count_nrequests.field_3.uint64_val = small_nrequests;
                                        if (small_nrequests == 0 || uptime == 0) {
                                          col_count_nrequests_ps.field_3.uint64_val = 0;
                                        }
                                        else {
                                          col_count_nrequests_ps.field_3.uint64_val =
                                               small_nrequests;
                                          if (999999999 < uptime) {
                                            col_count_nrequests_ps.field_3.uint64_val =
                                                 small_nrequests / (uptime / 1000000000);
                                          }
                                        }
                                        miblen = 7;
                                        sz_1 = 8;
                                        iVar5 = duckdb_je_mallctlnametomib
                                                          ("stats.arenas.0.small.nfills",&sz,&miblen
                                                          );
                                        if (iVar5 != 0) {
                                          format = 
                                          "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
                                          pcVar22 = "stats.arenas.0.small.nfills";
                                          goto LAB_00ce9b07;
                                        }
                                        local_778[0] = local_9c0;
                                        iVar5 = duckdb_je_mallctlbymib
                                                          (&sz,miblen,&small_nfills,&sz_1,
                                                           (void *)0x0,0);
                                        if (iVar5 == 0) {
                                          emitter_json_kv(emitter,"nfills",emitter_type_uint64,
                                                          &small_nfills);
                                          col_count_nfills.type = emitter_type_uint64;
                                          col_count_nfills.field_3.uint64_val = small_nfills;
                                          if (small_nfills == 0 || uptime == 0) {
                                            col_count_nfills_ps.field_3.uint64_val = 0;
                                          }
                                          else {
                                            col_count_nfills_ps.field_3.uint64_val = small_nfills;
                                            if (999999999 < uptime) {
                                              col_count_nfills_ps.field_3.uint64_val =
                                                   small_nfills / (uptime / 1000000000);
                                            }
                                          }
                                          miblen = 7;
                                          sz_1 = 8;
                                          iVar5 = duckdb_je_mallctlnametomib
                                                            ("stats.arenas.0.small.nflushes",&sz,
                                                             &miblen);
                                          if (iVar5 != 0) {
                                            format = 
                                            "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                            ;
                                            pcVar22 = "stats.arenas.0.small.nflushes";
                                            goto LAB_00ce9b07;
                                          }
                                          local_778[0] = local_9c0;
                                          iVar5 = duckdb_je_mallctlbymib
                                                            (&sz,miblen,&small_nflushes,&sz_1,
                                                             (void *)0x0,0);
                                          if (iVar5 == 0) {
                                            emitter_json_kv(emitter,"nflushes",emitter_type_uint64,
                                                            &small_nflushes);
                                            col_count_nflushes.type = emitter_type_uint64;
                                            col_count_nflushes.field_3.uint64_val = small_nflushes;
                                            if (small_nflushes == 0 || uptime == 0) {
                                              col_count_nflushes_ps.field_3 =
                                                   (anon_union_8_10_2a69db89_for_emitter_col_s_3)0;
                                            }
                                            else {
                                              col_count_nflushes_ps.field_3.uint64_val =
                                                   small_nflushes;
                                              if (999999999 < uptime) {
                                                col_count_nflushes_ps.field_3.uint64_val =
                                                     small_nflushes / (uptime / 1000000000);
                                              }
                                            }
                                            eVar6 = emitter->output;
                                            peVar17 = peVar4;
                                            if (eVar6 == emitter_output_table) {
                                              do {
                                                if (peVar17 == (emitter_col_t *)0x0) break;
                                                emitter_print_value(emitter,peVar17->justify,
                                                                    peVar17->width,peVar17->type,
                                                                    &peVar17->field_3);
                                                peVar17 = (peVar17->link).qre_next;
                                              } while (peVar17 != peVar4);
                                              emitter_table_printf
                                                        (emitter,anon_var_dwarf_63b9037 + 8);
                                              eVar6 = emitter->output;
                                            }
                                            if (eVar6 < emitter_output_table) {
                                              emitter->nesting_depth = emitter->nesting_depth + -1;
                                              emitter->item_at_depth = true;
                                              if (eVar6 != emitter_output_json_compact) {
                                                emitter_printf(emitter,anon_var_dwarf_63b9037 + 8);
                                                pcVar22 = anon_var_dwarf_63b940c + 7;
                                                if (emitter->output != emitter_output_json) {
                                                  pcVar22 = " ";
                                                }
                                                if (0 < emitter->nesting_depth) {
                                                  iVar5 = emitter->nesting_depth <<
                                                          (emitter->output != emitter_output_json);
                                                  if (iVar5 < 2) {
                                                    iVar5 = 1;
                                                  }
                                                  do {
                                                    emitter_printf(emitter,"%s",pcVar22);
                                                    iVar5 = iVar5 + -1;
                                                  } while (iVar5 != 0);
                                                }
                                              }
                                              emitter_printf(emitter,"}");
                                            }
                                            emitter_json_object_kv_begin(emitter,"large");
                                            local_288.field_3 =
                                                 (anon_union_8_10_2a69db89_for_emitter_col_s_3)
                                                 0x1ea36ec;
                                            miblen = 7;
                                            sz_1 = 8;
                                            iVar5 = duckdb_je_mallctlnametomib
                                                              ("stats.arenas.0.large.allocated",&sz,
                                                               &miblen);
                                            if (iVar5 != 0) {
                                              format = 
                                              "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                              ;
                                              pcVar22 = "stats.arenas.0.large.allocated";
                                              goto LAB_00ce9b07;
                                            }
                                            local_778[0] = local_9c0;
                                            iVar5 = duckdb_je_mallctlbymib
                                                              (&sz,miblen,&large_allocated,&sz_1,
                                                               (void *)0x0,0);
                                            if (iVar5 == 0) {
                                              emitter_json_kv(emitter,"allocated",emitter_type_size,
                                                              &large_allocated);
                                              local_3f0.type = emitter_type_size;
                                              local_3f0.field_3.size_val = large_allocated;
                                              miblen = 7;
                                              sz_1 = 8;
                                              iVar5 = duckdb_je_mallctlnametomib
                                                                ("stats.arenas.0.large.nmalloc",&sz,
                                                                 &miblen);
                                              if (iVar5 != 0) {
                                                format = 
                                                "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                ;
                                                pcVar22 = "stats.arenas.0.large.nmalloc";
                                                goto LAB_00ce9b07;
                                              }
                                              local_778[0] = local_9c0;
                                              iVar5 = duckdb_je_mallctlbymib
                                                                (&sz,miblen,&large_nmalloc,&sz_1,
                                                                 (void *)0x0,0);
                                              if (iVar5 == 0) {
                                                emitter_json_kv(emitter,"nmalloc",
                                                                emitter_type_uint64,&large_nmalloc);
                                                local_418.type = emitter_type_uint64;
                                                local_418.field_3.uint64_val = large_nmalloc;
                                                if (large_nmalloc == 0 || uptime == 0) {
                                                  local_3a0.field_3.uint64_val = 0;
                                                }
                                                else {
                                                  local_3a0.field_3.uint64_val = large_nmalloc;
                                                  if (999999999 < uptime) {
                                                    local_3a0.field_3.uint64_val =
                                                         large_nmalloc / (uptime / 1000000000);
                                                  }
                                                }
                                                miblen = 7;
                                                sz_1 = 8;
                                                iVar5 = duckdb_je_mallctlnametomib
                                                                  ("stats.arenas.0.large.ndalloc",
                                                                   &sz,&miblen);
                                                if (iVar5 != 0) {
                                                  format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.large.ndalloc";
                                                  goto LAB_00ce9b07;
                                                }
                                                local_778[0] = local_9c0;
                                                iVar5 = duckdb_je_mallctlbymib
                                                                  (&sz,miblen,&large_ndalloc,&sz_1,
                                                                   (void *)0x0,0);
                                                if (iVar5 == 0) {
                                                  emitter_json_kv(emitter,"ndalloc",
                                                                  emitter_type_uint64,&large_ndalloc
                                                                 );
                                                  local_440.type = emitter_type_uint64;
                                                  local_440.field_3.uint64_val = large_ndalloc;
                                                  if (large_ndalloc == 0 || uptime == 0) {
                                                    local_3c8.field_3.uint64_val = 0;
                                                  }
                                                  else {
                                                    local_3c8.field_3.uint64_val = large_ndalloc;
                                                    if (999999999 < uptime) {
                                                      local_3c8.field_3.uint64_val =
                                                           large_ndalloc / (uptime / 1000000000);
                                                    }
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar5 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.large.nrequests",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.large.nrequests";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = local_9c0;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nrequests,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"nrequests",
                                                                    emitter_type_uint64,
                                                                    &large_nrequests);
                                                    col_count_nrequests.type = emitter_type_uint64;
                                                    col_count_nrequests.field_3.uint64_val =
                                                         large_nrequests;
                                                    if (large_nrequests == 0 || uptime == 0) {
                                                      col_count_nrequests_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nrequests_ps.field_3.uint64_val =
                                                           large_nrequests;
                                                      if (999999999 < uptime) {
                                                        col_count_nrequests_ps.field_3.uint64_val =
                                                             large_nrequests / (uptime / 1000000000)
                                                        ;
                                                      }
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.large.nfills"
                                                                       ,&sz,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.large.nfills";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = local_9c0;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nfills,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"nfills",
                                                                    emitter_type_uint64,
                                                                    &large_nfills);
                                                    col_count_nfills.type = emitter_type_uint64;
                                                    col_count_nfills.field_3.uint64_val =
                                                         large_nfills;
                                                    if (large_nfills == 0 || uptime == 0) {
                                                      col_count_nfills_ps.field_3.uint64_val = 0;
                                                    }
                                                    else {
                                                      col_count_nfills_ps.field_3.uint64_val =
                                                           large_nfills;
                                                      if (999999999 < uptime) {
                                                        col_count_nfills_ps.field_3.uint64_val =
                                                             large_nfills / (uptime / 1000000000);
                                                      }
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.large.nflushes",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.large.nflushes";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = local_9c0;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&large_nflushes,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"nflushes",
                                                                    emitter_type_uint64,
                                                                    &large_nflushes);
                                                    col_count_nflushes.type = emitter_type_uint64;
                                                    col_count_nflushes.field_3.uint64_val =
                                                         large_nflushes;
                                                    if (large_nflushes == 0 || uptime == 0) {
                                                      col_count_nflushes_ps.field_3 =
                                                           (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0;
                                                  }
                                                  else {
                                                    col_count_nflushes_ps.field_3.uint64_val =
                                                         large_nflushes;
                                                    if (999999999 < uptime) {
                                                      col_count_nflushes_ps.field_3.uint64_val =
                                                           large_nflushes / (uptime / 1000000000);
                                                    }
                                                  }
                                                  eVar6 = emitter->output;
                                                  peVar17 = peVar4;
                                                  if (eVar6 == emitter_output_table) {
                                                    do {
                                                      if (peVar17 == (emitter_col_t *)0x0) break;
                                                      emitter_print_value(emitter,peVar17->justify,
                                                                          peVar17->width,
                                                                          peVar17->type,
                                                                          &peVar17->field_3);
                                                      peVar17 = (peVar17->link).qre_next;
                                                    } while (peVar17 != peVar4);
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63b9037 + 8);
                                                    eVar6 = emitter->output;
                                                  }
                                                  if (eVar6 < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (eVar6 != emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      pcVar22 = anon_var_dwarf_63b940c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  local_3c8.field_3.str_val =
                                                       (char *)(large_ndalloc + small_ndalloc);
                                                  local_288.field_3 =
                                                       (anon_union_8_10_2a69db89_for_emitter_col_s_3
                                                       )0x1ea37a5;
                                                  col_count_nrequests_ps.field_3.str_val =
                                                       (char *)(large_nrequests + small_nrequests);
                                                  local_3f0.field_3.str_val =
                                                       (char *)(large_allocated + small_allocated);
                                                  col_count_nfills_ps.field_3.str_val =
                                                       (char *)(large_nfills + small_nfills);
                                                  col_count_nflushes_ps.field_3.str_val =
                                                       (char *)(large_nflushes + small_nflushes);
                                                  local_3a0.field_3.str_val =
                                                       (char *)(large_nmalloc + small_nmalloc);
                                                  local_418.field_3.uint64_val =
                                                       (uint64_t)local_3a0.field_3;
                                                  local_440.field_3.uint64_val =
                                                       (uint64_t)local_3c8.field_3;
                                                  col_count_nrequests.field_3.uint64_val =
                                                       (uint64_t)col_count_nrequests_ps.field_3;
                                                  col_count_nfills.field_3.uint64_val =
                                                       (uint64_t)col_count_nfills_ps.field_3;
                                                  col_count_nflushes.field_3.uint64_val =
                                                       (uint64_t)col_count_nflushes_ps.field_3;
                                                  if (uptime == 0 ||
                                                      (char *)local_3a0.field_3.uint64_val ==
                                                      (char *)0x0) {
                                                    local_3a0.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    local_3a0.field_3.uint64_val =
                                                         local_3a0.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if ((char *)local_3c8.field_3.uint64_val ==
                                                      (char *)0x0 || uptime == 0) {
                                                    local_3c8.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    local_3c8.field_3.uint64_val =
                                                         local_3c8.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nrequests_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nrequests_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nrequests_ps.field_3.uint64_val =
                                                         col_count_nrequests_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nfills_ps.field_3.uint64_val == 0 ||
                                                      uptime == 0) {
                                                    col_count_nfills_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nfills_ps.field_3.uint64_val =
                                                         col_count_nfills_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  if (col_count_nflushes_ps.field_3.uint64_val == 0
                                                      || uptime == 0) {
                                                    col_count_nflushes_ps.field_3 =
                                                         (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                                                  }
                                                  else if (999999999 < uptime) {
                                                    col_count_nflushes_ps.field_3.uint64_val =
                                                         col_count_nflushes_ps.field_3.uint64_val /
                                                         (uptime / 1000000000);
                                                  }
                                                  peVar17 = peVar4;
                                                  if (emitter->output == emitter_output_table) {
                                                    do {
                                                      if (peVar17 == (emitter_col_t *)0x0) break;
                                                      emitter_print_value(emitter,peVar17->justify,
                                                                          peVar17->width,
                                                                          peVar17->type,
                                                                          &peVar17->field_3);
                                                      peVar17 = (peVar17->link).qre_next;
                                                    } while (peVar17 != peVar4);
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63b9037 + 8);
                                                    bVar23 = emitter->output == emitter_output_table
                                                    ;
                                                  }
                                                  else {
                                                    bVar23 = false;
                                                  }
                                                  aVar21 = local_9c0;
                                                  local_930 = 0x1500000000;
                                                  local_928 = 9;
                                                  local_920 = anon_var_dwarf_63b90fe + 9;
                                                  local_910 = &local_8e0;
                                                  local_8c0 = (emitter_justify_t *)&local_930;
                                                  local_8c8 = (emitter_justify_t *)&local_930;
                                                  local_918 = &local_8e0;
                                                  local_8e0 = 0x1000000001;
                                                  local_8d8 = 9;
                                                  local_8d0 = anon_var_dwarf_63b90fe + 9;
                                                  if (bVar23) {
                                                    peVar18 = (emitter_justify_t *)&local_930;
                                                    do {
                                                      emitter_print_value(emitter,*peVar18,
                                                                          peVar18[1],peVar18[2],
                                                                          peVar18 + 4);
                                                      peVar18 = *(emitter_justify_t **)(peVar18 + 6)
                                                      ;
                                                      if (peVar18 == (emitter_justify_t *)&local_930
                                                         ) break;
                                                    } while (peVar18 != (emitter_justify_t *)0x0);
                                                    emitter_table_printf
                                                              (emitter,anon_var_dwarf_63b9037 + 8);
                                                    local_8d8 = 6;
                                                    local_920 = "active:";
                                                    local_8d0 = (char *)(page * pactive);
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                  }
                                                  else {
                                                    local_8d8 = 6;
                                                    local_920 = "active:";
                                                    local_8d0 = (char *)(page * pactive);
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar5 = duckdb_je_mallctlnametomib
                                                                    ("stats.arenas.0.mapped",&sz,
                                                                     &miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.mapped";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&mapped,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"mapped",
                                                                    emitter_type_size,&mapped);
                                                    local_920 = "mapped:";
                                                    local_8d0 = (char *)mapped;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.retained",&sz
                                                                       ,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.retained";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&retained,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"retained",
                                                                    emitter_type_size,&retained);
                                                    local_920 = "retained:";
                                                    local_8d0 = (char *)retained;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.base",&sz,
                                                                       &miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.base";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&base,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"base",emitter_type_size
                                                                    ,&base);
                                                    local_920 = "base:";
                                                    local_8d0 = (char *)base;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.internal",&sz
                                                                       ,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.internal";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&internal,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"internal",
                                                                    emitter_type_size,&internal);
                                                    local_920 = "internal:";
                                                    local_8d0 = (char *)internal;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.metadata_edata",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.metadata_edata";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_edata,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"metadata_edata",
                                                                    emitter_type_size,
                                                                    &metadata_edata);
                                                    local_920 = "metadata_edata:";
                                                    local_8d0 = (char *)metadata_edata;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.metadata_rtree",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.metadata_rtree";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_rtree,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"metadata_rtree",
                                                                    emitter_type_size,
                                                                    &metadata_rtree);
                                                    local_920 = "metadata_rtree:";
                                                    local_8d0 = (char *)metadata_rtree;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.metadata_thp"
                                                                       ,&sz,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.metadata_thp";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&metadata_thp,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"metadata_thp",
                                                                    emitter_type_size,&metadata_thp)
                                                    ;
                                                    local_920 = "metadata_thp:";
                                                    local_8d0 = (char *)metadata_thp;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.tcache_bytes"
                                                                       ,&sz,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.tcache_bytes";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&tcache_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"tcache_bytes",
                                                                    emitter_type_size,&tcache_bytes)
                                                    ;
                                                    local_920 = "tcache_bytes:";
                                                    local_8d0 = (char *)tcache_bytes;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.tcache_stashed_bytes",&sz,&miblen)
                                                  ;
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.tcache_stashed_bytes";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,
                                                                     &tcache_stashed_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"tcache_stashed_bytes",
                                                                    emitter_type_size,
                                                                    &tcache_stashed_bytes);
                                                    local_920 = "tcache_stashed_bytes:";
                                                    local_8d0 = (char *)tcache_stashed_bytes;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.resident",&sz
                                                                       ,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.resident";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&resident,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"resident",
                                                                    emitter_type_size,&resident);
                                                    local_920 = "resident:";
                                                    local_8d0 = (char *)resident;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.abandoned_vm"
                                                                       ,&sz,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.abandoned_vm";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&abandoned_vm,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"abandoned_vm",
                                                                    emitter_type_size,&abandoned_vm)
                                                    ;
                                                    local_920 = "abandoned_vm:";
                                                    local_8d0 = (char *)abandoned_vm;
                                                    if (emitter->output == emitter_output_table) {
                                                      peVar18 = (emitter_justify_t *)&local_930;
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      ("stats.arenas.0.extent_avail"
                                                                       ,&sz,&miblen);
                                                    if (iVar5 != 0) {
                                                      format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.extent_avail";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&extent_avail,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_json_kv(emitter,"extent_avail",
                                                                    emitter_type_size,&extent_avail)
                                                    ;
                                                    local_920 = "extent_avail:";
                                                    local_8d0 = (char *)extent_avail;
                                                    peVar18 = (emitter_justify_t *)&local_930;
                                                    if (emitter->output == emitter_output_table) {
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 ==
                                                            (emitter_justify_t *)&local_930) break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                    }
                                                    uVar13 = uptime;
                                                    if ((char)local_934 != '\0') {
                                                      row.cols.qlh_first =
                                                           (anon_struct_8_1_803fbc3e_for_cols)
                                                           (emitter_col_t *)0x0;
                                                      mutex_stats_init_cols
                                                                (&row,anon_var_dwarf_63b90fe + 9,
                                                                 (emitter_col_t *)&sz_1,
                                                                 (emitter_col_t *)&sz,col32);
                                                      emitter_json_object_kv_begin
                                                                (emitter,"mutexes");
                                                      if (emitter->output == emitter_output_table) {
                                                        eVar16 = row;
                                                        if (row.cols.qlh_first !=
                                                            (emitter_col_t *)0x0) {
                                                          do {
                                                            emitter_print_value(emitter,((
                                                  emitter_col_t *)eVar16.cols.qlh_first)->justify,
                                                  ((emitter_col_t *)eVar16.cols.qlh_first)->width,
                                                  ((emitter_col_t *)eVar16.cols.qlh_first)->type,
                                                  &((emitter_col_t *)eVar16.cols.qlh_first)->field_3
                                                  );
                                                  eVar16.cols.qlh_first =
                                                       (anon_struct_8_1_803fbc3e_for_cols)
                                                       (((emitter_col_t *)eVar16.cols.qlh_first)->
                                                       link).qre_next;
                                                  if (eVar16.cols.qlh_first == (emitter_col_t *)0x0)
                                                  break;
                                                  } while (eVar16.cols.qlh_first !=
                                                           row.cols.qlh_first);
                                                  }
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63b9037 + 8);
                                                  }
                                                  miblen_new = 7;
                                                  ptVar8 = (tsd_t *)__tls_get_addr(&PTR_0249db70);
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar14,&miblen,0,
                                                                     "stats.arenas",&miblen_new);
                                                  if (iVar5 == 0) {
                                                    local_9a8 = aVar21;
                                                    miblen_new = 7;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_mibnametomib
                                                                      (ptVar14,&miblen,3,"mutexes",
                                                                       &miblen_new);
                                                    if (iVar5 == 0) {
                                                      uVar9 = uVar13 / 1000000000;
                                                      uVar15 = 0;
                                                      local_5d0 = ptVar8;
                                                      do {
                                                        aVar21 = (
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3)
                                                  ((anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (duckdb_je_arena_mutex_names + uVar15))->str_val;
                                                  local_908 = uVar15;
                                                  emitter_json_object_kv_begin
                                                            (emitter,aVar21.str_val);
                                                  miblen_new = 7;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar14,&miblen,4,
                                                                     aVar21.str_val,&miblen_new);
                                                  if (iVar5 != 0) goto LAB_00ce96e0;
                                                  local_780.int_val = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  local_9d8 = aVar21;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,"num_ops",
                                                                     &miblen_new,local_778,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  local_758 = 5;
                                                  local_750 = local_778[0];
                                                  if (uVar13 == 0) {
                                                    local_750.uint64_val = 0;
                                                  }
                                                  if (local_778[0].uint64_val != 0 &&
                                                      999999999 < uVar13) {
                                                    local_750.uint64_val =
                                                         local_778[0].uint64_val / uVar9;
                                                  }
                                                  local_730 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,"num_wait",
                                                                     &miblen_new,local_728,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  local_708 = 5;
                                                  local_700 = local_728[0];
                                                  if (uVar13 == 0) {
                                                    local_700 = 0;
                                                  }
                                                  if (local_728[0] != 0 && 999999999 < uVar13) {
                                                    local_700 = local_728[0] / uVar9;
                                                  }
                                                  local_6e0 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,
                                                                     "num_spin_acq",&miblen_new,
                                                                     local_6d8,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  local_6b8 = 5;
                                                  local_6b0 = local_6d8[0];
                                                  if (uVar13 == 0) {
                                                    local_6b0 = 0;
                                                  }
                                                  if (local_6d8[0] != 0 && 999999999 < uVar13) {
                                                    local_6b0 = local_6d8[0] / uVar9;
                                                  }
                                                  local_690 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,
                                                                     "num_owner_switch",&miblen_new,
                                                                     local_688,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  local_668 = 5;
                                                  local_660 = local_688[0];
                                                  if (uVar13 == 0) {
                                                    local_660 = 0;
                                                  }
                                                  if (local_688[0] != 0 && 999999999 < uVar13) {
                                                    local_660 = local_688[0] / uVar9;
                                                  }
                                                  local_640 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,
                                                                     "total_wait_time",&miblen_new,
                                                                     local_638,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  local_618 = 5;
                                                  local_610 = local_638[0];
                                                  if (uVar13 == 0) {
                                                    local_610 = 0;
                                                  }
                                                  if (local_638[0] != 0 && 999999999 < uVar13) {
                                                    local_610 = local_638[0] / uVar9;
                                                  }
                                                  local_5f0 = 5;
                                                  miblen_new = 7;
                                                  sz_40 = 8;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,
                                                                     "max_wait_time",&miblen_new,
                                                                     local_5e8,&sz_40,(void *)0x0,0)
                                                  ;
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  col32[0].type = emitter_type_uint32;
                                                  miblen_new = 7;
                                                  sz_40 = 4;
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_bymibname
                                                                    (ptVar14,&miblen,5,
                                                                     "max_num_thds",&miblen_new,
                                                                     &col32[0].field_3,&sz_40,
                                                                     (void *)0x0,0);
                                                  if (iVar5 != 0) goto LAB_00ce96c6;
                                                  mutex_stats_emit(emitter,&row,(emitter_col_t *)&sz
                                                                   ,col32);
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      pcVar22 = anon_var_dwarf_63b940c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                    ptVar8 = local_5d0;
                                                  }
                                                  aVar21 = local_9c0;
                                                  uVar15 = local_908 + 1;
                                                  } while (uVar15 != 0xc);
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    pcVar22 = anon_var_dwarf_63b940c + 7;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  goto LAB_00ce8010;
                                                  }
                                                  }
LAB_00ce96e0:
                                                  pcVar22 = 
                                                  "<jemalloc>: Failure in ctl_mibnametomib()\n";
                                                  goto LAB_00ce96cd;
                                                  }
LAB_00ce8010:
                                                  if ((char)local_8ec != '\0') {
                                                    stats_arena_bins_print
                                                              (emitter,(_Bool)(char)local_934,
                                                               (uint)local_900,uptime);
                                                  }
                                                  if ((char)local_8e8 != '\0') {
                                                    stats_arena_lextents_print
                                                              (emitter,(uint)local_900,uptime);
                                                  }
                                                  if ((char)local_8f0 != '\0') {
                                                    stats_arena_extents_print
                                                              (emitter,(uint)local_900);
                                                  }
                                                  if (!hpa) {
                                                    return;
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar5 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.npurge_passes",&sz,
                                                  &miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.hpa_shard.npurge_passes"
                                                  ;
LAB_00ce9b07:
                                                  duckdb_je_malloc_printf(format,pcVar22);
                                                  abort();
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npurge_passes,&sz_1
                                                                     ,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.npurges",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.hpa_shard.npurges";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npurges,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.nhugifies",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.hpa_shard.nhugifies";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nhugifies,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.ndehugifies",&sz,&miblen
                                                  );
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.hpa_shard.ndehugifies";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndehugifies,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_sec_bytes",&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = "stats.arenas.0.hpa_sec_bytes";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&sec_bytes,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_kv_note(emitter,"sec_bytes",
                                                                    "Bytes in small extent cache",
                                                                    emitter_type_size,&sec_bytes,
                                                                    (char *)0x0,emitter_type_bool,
                                                                    (void *)0x0);
                                                    uVar9 = 0;
                                                    if ((npurge_passes != 0 && uptime != 0) &&
                                                       (uVar9 = npurge_passes, 999999999 < uptime))
                                                    {
                                                      uVar9 = npurge_passes / (uptime / 1000000000);
                                                    }
                                                    if (npurges == 0 || uptime == 0) {
                                                      uVar10 = 0;
                                                    }
                                                    else {
                                                      uVar10 = npurges;
                                                      if (999999999 < uptime) {
                                                        uVar10 = npurges / (uptime / 1000000000);
                                                      }
                                                    }
                                                    if (nhugifies == 0 || uptime == 0) {
                                                      uVar11 = 0;
                                                    }
                                                    else {
                                                      uVar11 = nhugifies;
                                                      if (999999999 < uptime) {
                                                        uVar11 = nhugifies / (uptime / 1000000000);
                                                      }
                                                    }
                                                    if (ndehugifies == 0 || uptime == 0) {
                                                      uVar12 = 0;
                                                    }
                                                    else {
                                                      uVar12 = ndehugifies;
                                                      if (999999999 < uptime) {
                                                        uVar12 = ndehugifies / (uptime / 1000000000)
                                                        ;
                                                      }
                                                    }
                                                    emitter_table_printf
                                                              (emitter,
                                                  "HPA shard stats:\n  Purge passes: %lu (%lu / sec)\n  Purges: %lu (%lu / sec)\n  Hugeifies: %lu (%lu / sec)\n  Dehugifies: %lu (%lu / sec)\n\n"
                                                  ,npurge_passes,uVar9,npurges,uVar10,nhugifies,
                                                  uVar11,ndehugifies,uVar12);
                                                  emitter_json_object_kv_begin(emitter,"hpa_shard");
                                                  emitter_json_kv(emitter,"npurge_passes",
                                                                  emitter_type_uint64,&npurge_passes
                                                                 );
                                                  emitter_json_kv(emitter,"npurges",
                                                                  emitter_type_uint64,&npurges);
                                                  emitter_json_kv(emitter,"nhugifies",
                                                                  emitter_type_uint64,&nhugifies);
                                                  emitter_json_kv(emitter,"ndehugifies",
                                                                  emitter_type_uint64,&ndehugifies);
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar5 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_huge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_huge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_huge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_huge",
                                                  &sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_huge";
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.npageslabs_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.nactive_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.full_slabs.ndirty_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_table_printf
                                                              (emitter,
                                                  "  In full slabs:\n      npageslabs: %zu huge, %zu nonhuge\n      nactive: %zu huge, %zu nonhuge \n      ndirty: %zu huge, %zu nonhuge \n      nretained: 0 huge, %zu nonhuge \n"
                                                  ,npageslabs_huge);
                                                  emitter_json_object_kv_begin(emitter,"full_slabs")
                                                  ;
                                                  emitter_json_kv(emitter,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(emitter,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(emitter,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(emitter,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(emitter,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(emitter,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      pcVar22 = anon_var_dwarf_63b940c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  miblen = 7;
                                                  sz_1 = 8;
                                                  iVar5 = duckdb_je_mallctlnametomib
                                                                    (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_huge"
                                                  ,&sz,&miblen);
                                                  aVar21 = local_9c0;
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_huge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = local_9c0;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_huge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_huge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_huge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_huge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_huge,&sz_1,
                                                                     (void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.npageslabs_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&npageslabs_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.nactive_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&nactive_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    miblen = 7;
                                                    sz_1 = 8;
                                                    iVar5 = duckdb_je_mallctlnametomib
                                                                      (
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_nonhuge"
                                                  ,&sz,&miblen);
                                                  if (iVar5 != 0) {
                                                    format = 
                                                  "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n"
                                                  ;
                                                  pcVar22 = 
                                                  "stats.arenas.0.hpa_shard.empty_slabs.ndirty_nonhuge"
                                                  ;
                                                  goto LAB_00ce9b07;
                                                  }
                                                  local_778[0] = aVar21;
                                                  iVar5 = duckdb_je_mallctlbymib
                                                                    (&sz,miblen,&ndirty_nonhuge,
                                                                     &sz_1,(void *)0x0,0);
                                                  if (iVar5 == 0) {
                                                    emitter_table_printf
                                                              (emitter,
                                                  "  In empty slabs:\n      npageslabs: %zu huge, %zu nonhuge\n      nactive: %zu huge, %zu nonhuge \n      ndirty: %zu huge, %zu nonhuge \n      nretained: 0 huge, %zu nonhuge \n"
                                                  ,npageslabs_huge,npageslabs_nonhuge,nactive_huge,
                                                  nactive_nonhuge,ndirty_huge,ndirty_nonhuge,
                                                  (npageslabs_nonhuge * 0x200 - nactive_nonhuge) -
                                                  ndirty_nonhuge);
                                                  emitter_json_object_kv_begin
                                                            (emitter,"empty_slabs");
                                                  eVar19 = emitter_type_size;
                                                  emitter_json_kv(emitter,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(emitter,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(emitter,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(emitter,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(emitter,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(emitter,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      pcVar22 = anon_var_dwarf_63b940c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  miblen = 0x1400000001;
                                                  sz_1 = 0x1400000001;
                                                  local_9e0 = emitter_type_title;
                                                  local_9d8.str_val = "size";
                                                  local_9a0 = col32;
                                                  col32[0].link.qre_prev = (emitter_col_t *)&miblen;
                                                  col32[0].justify = emitter_justify_right;
                                                  col32[0].width = 4;
                                                  col32[0].type = emitter_type_unsigned;
                                                  local_9d0 = (emitter_col_t *)&miblen_new;
                                                  miblen_new = 0x400000001;
                                                  local_7c0.str_val = "ind";
                                                  col32[0].link.qre_next = (emitter_col_t *)&sz_40;
                                                  sz_40 = 0x1000000001;
                                                  local_7b8 = (emitter_col_t *)&row;
                                                  row.cols.qlh_first =
                                                       (anon_struct_8_1_803fbc3e_for_cols)
                                                       (emitter_col_t *)0x1000000001;
                                                  local_8a0 = &local_170;
                                                  local_170.justify = emitter_justify_right;
                                                  local_170.width = 0x10;
                                                  local_80.link.qre_prev = &local_58;
                                                  local_58.justify = emitter_justify_right;
                                                  local_58.width = 0x10;
                                                  local_58.field_3.str_val = "nactive_huge";
                                                  local_1c0.link.qre_prev = &local_198;
                                                  local_198.justify = emitter_justify_right;
                                                  local_198.width = 0x10;
                                                  local_a8.link.qre_prev = &local_80;
                                                  local_80.justify = emitter_justify_right;
                                                  local_80.width = 0x10;
                                                  local_80.field_3.str_val = "ndirty_huge";
                                                  local_1e8.link.qre_prev = &local_1c0;
                                                  local_1c0.justify = emitter_justify_right;
                                                  local_1c0.width = 0x14;
                                                  local_d0.link.qre_prev = &local_a8;
                                                  local_a8.justify = emitter_justify_right;
                                                  local_a8.width = 0x14;
                                                  local_a8.field_3.str_val = "npageslabs_nonhuge";
                                                  local_210.link.qre_prev = &local_1e8;
                                                  local_1e8.justify = emitter_justify_right;
                                                  local_1e8.width = 0x14;
                                                  local_f8.link.qre_prev = &local_d0;
                                                  local_d0.justify = emitter_justify_right;
                                                  local_d0.width = 0x14;
                                                  local_d0.field_3.str_val = "nactive_nonhuge";
                                                  local_238.link.qre_prev = &local_210;
                                                  local_210.justify = emitter_justify_right;
                                                  local_210.width = 0x14;
                                                  local_120.link.qre_prev = &local_f8;
                                                  local_f8.justify = emitter_justify_right;
                                                  local_f8.width = 0x14;
                                                  local_f8.field_3.str_val = "ndirty_nonhuge";
                                                  local_998 = &local_238;
                                                  local_238.justify = emitter_justify_right;
                                                  local_238.width = 0x14;
                                                  local_9c8 = &local_120;
                                                  local_120.justify = emitter_justify_right;
                                                  local_120.width = 0x14;
                                                  local_120.field_3.str_val = "nretained_nonhuge";
                                                  miblen_new_9 = 7;
                                                  local_9b0 = eVar19;
                                                  local_8b0 = eVar19;
                                                  local_898 = local_9a0;
                                                  local_7c8 = local_9e0;
                                                  local_7b0 = (emitter_col_t *)&sz_1;
                                                  local_238.type = eVar19;
                                                  local_238.link.qre_next = col32[0].link.qre_prev;
                                                  local_210.type = eVar19;
                                                  local_210.link.qre_next = local_998;
                                                  local_1e8.type = eVar19;
                                                  local_1e8.link.qre_next = local_238.link.qre_prev;
                                                  local_1c0.type = eVar19;
                                                  local_1c0.link.qre_next = local_210.link.qre_prev;
                                                  local_198.type = eVar19;
                                                  local_198.link.qre_next = local_1e8.link.qre_prev;
                                                  local_198.link.qre_prev = local_8a0;
                                                  local_170.type = eVar19;
                                                  local_170.link.qre_next = local_1c0.link.qre_prev;
                                                  local_170.link.qre_prev = col32[0].link.qre_next;
                                                  local_120.type = local_9e0;
                                                  local_120.link.qre_next = (emitter_col_t *)&sz_1;
                                                  local_f8.type = local_9e0;
                                                  local_f8.link.qre_next = local_9c8;
                                                  local_d0.type = local_9e0;
                                                  local_d0.link.qre_next = local_120.link.qre_prev;
                                                  local_a8.type = local_9e0;
                                                  local_a8.link.qre_next = local_f8.link.qre_prev;
                                                  local_80.type = local_9e0;
                                                  local_80.link.qre_next = local_d0.link.qre_prev;
                                                  local_58.type = local_9e0;
                                                  local_58.link.qre_next = local_a8.link.qre_prev;
                                                  local_58.link.qre_prev = local_7b8;
                                                  ptVar8 = (tsd_t *)__tls_get_addr(&PTR_0249db70);
                                                  ptVar14 = ptVar8;
                                                  if ((ptVar8->state).repr != '\0') {
                                                    ptVar14 = duckdb_je_tsd_fetch_slow(ptVar8,false)
                                                    ;
                                                  }
                                                  iVar5 = duckdb_je_ctl_mibnametomib
                                                                    (ptVar14,&sz,0,"stats.arenas",
                                                                     &miblen_new_9);
                                                  if (iVar5 == 0) {
                                                    local_778[0] = local_9c0;
                                                    miblen_new_9 = 7;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_mibnametomib
                                                                      (ptVar14,&sz,3,
                                                                       "hpa_shard.nonfull_slabs",
                                                                       &miblen_new_9);
                                                    if (iVar5 == 0) {
                                                      emitter_table_printf
                                                                (emitter,"  In nonfull slabs:\n");
                                                      peVar17 = (emitter_col_t *)&sz_1;
                                                      if (emitter->output == emitter_output_table) {
                                                        do {
                                                          emitter_print_value(emitter,peVar17->
                                                  justify,peVar17->width,peVar17->type,
                                                  &peVar17->field_3);
                                                  peVar17 = (peVar17->link).qre_next;
                                                  if (peVar17 == (emitter_col_t *)&sz_1) break;
                                                  } while (peVar17 != (emitter_col_t *)0x0);
                                                  emitter_table_printf
                                                            (emitter,anon_var_dwarf_63b9037 + 8);
                                                  }
                                                  emitter_json_array_kv_begin
                                                            (emitter,"nonfull_slabs");
                                                  uVar13 = 0;
                                                  uVar20 = 0;
                                                  while( true ) {
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    local_908 = uVar13;
                                                    local_760 = uVar13;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,
                                                                       "npageslabs_huge",
                                                                       &miblen_new_9,
                                                                       &npageslabs_huge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar5 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,"nactive_huge",
                                                                       &miblen_new_9,&nactive_huge,
                                                                       &sz_63,(void *)0x0,0);
                                                    if (iVar5 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,"ndirty_huge",
                                                                       &miblen_new_9,&ndirty_huge,
                                                                       &sz_63,(void *)0x0,0);
                                                    if (iVar5 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,
                                                                       "npageslabs_nonhuge",
                                                                       &miblen_new_9,
                                                                       &npageslabs_nonhuge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar5 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,
                                                                       "nactive_nonhuge",
                                                                       &miblen_new_9,
                                                                       &nactive_nonhuge,&sz_63,
                                                                       (void *)0x0,0);
                                                    if (iVar5 != 0) break;
                                                    miblen_new_9 = 7;
                                                    sz_63 = 8;
                                                    ptVar14 = ptVar8;
                                                    if ((ptVar8->state).repr != '\0') {
                                                      ptVar14 = duckdb_je_tsd_fetch_slow
                                                                          (ptVar8,false);
                                                    }
                                                    iVar5 = duckdb_je_ctl_bymibname
                                                                      (ptVar14,&sz,6,
                                                                       "ndirty_nonhuge",
                                                                       &miblen_new_9,&ndirty_nonhuge
                                                                       ,&sz_63,(void *)0x0,0);
                                                    sVar3 = npageslabs_nonhuge;
                                                    sVar2 = nactive_nonhuge;
                                                    sVar1 = ndirty_nonhuge;
                                                    if (iVar5 != 0) break;
                                                    uVar24 = npageslabs_huge == 0 &&
                                                             npageslabs_nonhuge == 0;
                                                    local_9c0.bool_val = (_Bool)uVar24;
                                                    if ((~uVar20 & 1) == 0 &&
                                                        (npageslabs_huge != 0 ||
                                                        npageslabs_nonhuge != 0)) {
                                                      emitter_table_printf
                                                                (emitter,
                                                  "                     ---\n");
                                                  uVar24 = local_9c0._0_1_;
                                                  }
                                                  local_9a8 = *(
                                                  anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                                                  (duckdb_je_sz_pind2sz_tab + local_908);
                                                  col32[0].field_3.uint64_val = local_908;
                                                  local_8a8.size_val = npageslabs_huge;
                                                  local_170.field_3.size_val = nactive_huge;
                                                  local_198.field_3.size_val = ndirty_huge;
                                                  local_1c0.field_3.size_val = npageslabs_nonhuge;
                                                  local_1e8.field_3.size_val = nactive_nonhuge;
                                                  local_210.field_3.size_val = ndirty_nonhuge;
                                                  local_238.field_3.str_val =
                                                       (char *)(sVar3 * 0x200 - (sVar2 + sVar1));
                                                  if (uVar24 == '\0') {
                                                    eVar6 = emitter->output;
                                                    peVar18 = (emitter_justify_t *)&miblen;
                                                    if (eVar6 == emitter_output_table) {
                                                      do {
                                                        emitter_print_value(emitter,*peVar18,
                                                                            peVar18[1],peVar18[2],
                                                                            peVar18 + 4);
                                                        peVar18 = *(emitter_justify_t **)
                                                                   (peVar18 + 6);
                                                        if (peVar18 == (emitter_justify_t *)&miblen)
                                                        break;
                                                      } while (peVar18 != (emitter_justify_t *)0x0);
                                                      emitter_table_printf
                                                                (emitter,anon_var_dwarf_63b9037 + 8)
                                                      ;
                                                      goto LAB_00ce9293;
                                                    }
                                                  }
                                                  else {
LAB_00ce9293:
                                                    eVar6 = emitter->output;
                                                  }
                                                  if (eVar6 < emitter_output_table) {
                                                    if (emitter->emitted_key == true) {
                                                      emitter->emitted_key = false;
                                                    }
                                                    else {
                                                      if (emitter->item_at_depth == true) {
                                                        emitter_printf(emitter,",");
                                                        eVar6 = emitter->output;
                                                      }
                                                      if (eVar6 != emitter_output_json_compact) {
                                                        emitter_printf(emitter,
                                                  anon_var_dwarf_63b9037 + 8);
                                                  pcVar22 = anon_var_dwarf_63b940c + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar22 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar5 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar5 < 2) {
                                                      iVar5 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar22);
                                                      iVar5 = iVar5 + -1;
                                                    } while (iVar5 != 0);
                                                  }
                                                  }
                                                  }
                                                  emitter_printf(emitter,"{");
                                                  emitter->nesting_depth =
                                                       emitter->nesting_depth + 1;
                                                  emitter->item_at_depth = false;
                                                  }
                                                  emitter_json_kv(emitter,"npageslabs_huge",
                                                                  emitter_type_size,&npageslabs_huge
                                                                 );
                                                  emitter_json_kv(emitter,"nactive_huge",
                                                                  emitter_type_size,&nactive_huge);
                                                  emitter_json_kv(emitter,"ndirty_huge",
                                                                  emitter_type_size,&ndirty_huge);
                                                  emitter_json_kv(emitter,"npageslabs_nonhuge",
                                                                  emitter_type_size,
                                                                  &npageslabs_nonhuge);
                                                  emitter_json_kv(emitter,"nactive_nonhuge",
                                                                  emitter_type_size,&nactive_nonhuge
                                                                 );
                                                  emitter_json_kv(emitter,"ndirty_nonhuge",
                                                                  emitter_type_size,&ndirty_nonhuge)
                                                  ;
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      pcVar22 = anon_var_dwarf_63b940c + 7;
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar5 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        if (iVar5 < 2) {
                                                          iVar5 = 1;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  uVar13 = local_908 + 1;
                                                  uVar20 = local_9c0._0_1_;
                                                  if (uVar13 == 0x40) {
                                                    if (emitter->output < emitter_output_table) {
                                                      emitter->nesting_depth =
                                                           emitter->nesting_depth + -1;
                                                      emitter->item_at_depth = true;
                                                      if (emitter->output !=
                                                          emitter_output_json_compact) {
                                                        emitter_printf(emitter,
                                                  anon_var_dwarf_63b9037 + 8);
                                                  pcVar22 = anon_var_dwarf_63b940c + 7;
                                                  if (emitter->output != emitter_output_json) {
                                                    pcVar22 = " ";
                                                  }
                                                  if (0 < emitter->nesting_depth) {
                                                    iVar5 = emitter->nesting_depth <<
                                                            (emitter->output != emitter_output_json)
                                                    ;
                                                    if (iVar5 < 2) {
                                                      iVar5 = 1;
                                                    }
                                                    do {
                                                      emitter_printf(emitter,"%s",pcVar22);
                                                      iVar5 = iVar5 + -1;
                                                    } while (iVar5 != 0);
                                                  }
                                                  }
                                                  emitter_printf(emitter,"]");
                                                  if (emitter->output < emitter_output_table) {
                                                    emitter->nesting_depth =
                                                         emitter->nesting_depth + -1;
                                                    emitter->item_at_depth = true;
                                                    pcVar22 = anon_var_dwarf_63b940c + 7;
                                                    if (emitter->output !=
                                                        emitter_output_json_compact) {
                                                      emitter_printf(emitter,anon_var_dwarf_63b9037
                                                                             + 8);
                                                      if (emitter->output != emitter_output_json) {
                                                        pcVar22 = " ";
                                                      }
                                                      if (0 < emitter->nesting_depth) {
                                                        iVar7 = emitter->nesting_depth <<
                                                                (emitter->output !=
                                                                emitter_output_json);
                                                        iVar5 = 1;
                                                        if (1 < iVar7) {
                                                          iVar5 = iVar7;
                                                        }
                                                        do {
                                                          emitter_printf(emitter,"%s",pcVar22);
                                                          iVar5 = iVar5 + -1;
                                                        } while (iVar5 != 0);
                                                      }
                                                    }
                                                    emitter_printf(emitter,"}");
                                                  }
                                                  }
                                                  if (local_9c0.bool_val == false) {
                                                    return;
                                                  }
                                                  emitter_table_printf
                                                            (emitter,"                     ---\n");
                                                  return;
                                                  }
                                                  }
LAB_00ce96c6:
                                                  pcVar22 = 
                                                  "<jemalloc>: Failure in ctl_bymibname()\n";
                                                  goto LAB_00ce96cd;
                                                  }
                                                  }
                                                  goto LAB_00ce96e0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar22 = "<jemalloc>: Failure in xmallctlbymib()\n";
LAB_00ce96cd:
  duckdb_je_malloc_write(pcVar22);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents, bool hpa) {
	char name[ARENA_NAME_LEN];
	char *namep = name;
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_edata, metadata_rtree,
	    metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes, tcache_stashed_bytes, abandoned_vm;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);
	if (i != MALLCTL_ARENAS_ALL && i != MALLCTL_ARENAS_DESTROYED) {
		CTL_M1_GET("arena.0.name", i, (void *)&namep, const char *);
		emitter_kv(emitter, "name", "name", emitter_type_string, &namep);
	}

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 10, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 10, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_edata)
	GET_AND_EMIT_MEM_STAT(metadata_rtree)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(tcache_stashed_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(abandoned_vm)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
	if (hpa) {
		stats_arena_hpa_shard_print(emitter, i, uptime);
	}
}